

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
KeyUsage<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::TestBody
          (KeyUsage<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *this)

{
  char *in_RSI;
  
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "intermediate-lacks-signing-key-usage/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-has-keycertsign-but-not-ca/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/rsa-decipherOnly.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/rsa-digitalSignature.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/rsa-keyAgreement.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/rsa-keyEncipherment.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/ec-decipherOnly.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/ec-digitalSignature.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/ec-keyAgreement.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "target-serverauth-various-keyusages/ec-keyEncipherment.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "root-lacks-keycertsign-key-usage/main.test",in_RSI);
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             "root-lacks-keycertsign-key-usage/ta-with-constraints.test",in_RSI);
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, KeyUsage) {
  this->RunTest("intermediate-lacks-signing-key-usage/main.test");
  this->RunTest("target-has-keycertsign-but-not-ca/main.test");

  this->RunTest("target-serverauth-various-keyusages/rsa-decipherOnly.test");
  this->RunTest(
      "target-serverauth-various-keyusages/rsa-digitalSignature.test");
  this->RunTest("target-serverauth-various-keyusages/rsa-keyAgreement.test");
  this->RunTest("target-serverauth-various-keyusages/rsa-keyEncipherment.test");

  this->RunTest("target-serverauth-various-keyusages/ec-decipherOnly.test");
  this->RunTest("target-serverauth-various-keyusages/ec-digitalSignature.test");
  this->RunTest("target-serverauth-various-keyusages/ec-keyAgreement.test");
  this->RunTest("target-serverauth-various-keyusages/ec-keyEncipherment.test");

  this->RunTest("root-lacks-keycertsign-key-usage/main.test");
  this->RunTest("root-lacks-keycertsign-key-usage/ta-with-constraints.test");
}